

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O3

void __thiscall Liby::EventQueue::destroy(EventQueue *this)

{
  FileDescriptor *__ptr;
  
  this->eventfd_ = -1;
  __ptr = (this->eventfp_)._M_t.
          super___uniq_ptr_impl<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>.
          _M_t.
          super__Tuple_impl<0UL,_Liby::FileDescriptor_*,_std::default_delete<Liby::FileDescriptor>_>
          .super__Head_base<0UL,_Liby::FileDescriptor_*,_false>._M_head_impl;
  (this->eventfp_)._M_t.
  super___uniq_ptr_impl<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>._M_t.
  super__Tuple_impl<0UL,_Liby::FileDescriptor_*,_std::default_delete<Liby::FileDescriptor>_>.
  super__Head_base<0UL,_Liby::FileDescriptor_*,_false>._M_head_impl = (FileDescriptor *)0x0;
  if (__ptr != (FileDescriptor *)0x0) {
    std::default_delete<Liby::FileDescriptor>::operator()
              ((default_delete<Liby::FileDescriptor> *)&this->eventfp_,__ptr);
  }
  std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
            ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)
             &this->eventChanelPtr_,(pointer)0x0);
  return;
}

Assistant:

void EventQueue::destroy() {
    eventfd_ = -1;
    eventfp_.reset();
#ifdef __APPLE__
    event2fd_ = -1;
    event2fp_.reset();
#endif
    eventChanelPtr_.reset();
}